

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_counted_impl.hpp
# Opt level: O1

void * __thiscall
boost::detail::
sp_counted_impl_pd<std::basic_ofstream<char,_std::char_traits<char>_>_*,_boost::detail::sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
::get_deleter(sp_counted_impl_pd<std::basic_ofstream<char,_std::char_traits<char>_>_*,_boost::detail::sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
              *this,sp_typeinfo *ti)

{
  char *__s1;
  int iVar1;
  sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_> *psVar2;
  bool bVar3;
  
  __s1 = *(char **)(ti + 8);
  if (__s1 == "N5boost6detail13sp_ms_deleterISt14basic_ofstreamIcSt11char_traitsIcEEEE") {
    bVar3 = true;
  }
  else if (*__s1 == '*') {
    bVar3 = false;
  }
  else {
    iVar1 = strcmp(__s1,"N5boost6detail13sp_ms_deleterISt14basic_ofstreamIcSt11char_traitsIcEEEE");
    bVar3 = iVar1 == 0;
  }
  psVar2 = (sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_> *)0x0;
  if (bVar3) {
    psVar2 = &this->del;
  }
  return psVar2;
}

Assistant:

virtual void * get_deleter( sp_typeinfo const & ti )
    {
        return ti == BOOST_SP_TYPEID(D)? &reinterpret_cast<char&>( del ): 0;
    }